

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

void __thiscall ot::commissioner::JobManager::CleanupJobs(JobManager *this)

{
  Job *this_00;
  bool bVar1;
  reference ppJVar2;
  bool local_41;
  bool condition;
  Job *job;
  iterator __end2;
  iterator __begin2;
  JobPool *__range2;
  JobManager *this_local;
  
  __end2 = std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::begin
                     (&this->mJobPool);
  job = (Job *)std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::end
                         (&this->mJobPool);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
                                *)&job);
    if (!bVar1) {
      std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::clear
                (&this->mJobPool);
      std::__cxx11::string::clear();
      return;
    }
    ppJVar2 = __gnu_cxx::
              __normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppJVar2;
    local_41 = true;
    if (this_00 != (Job *)0x0) {
      local_41 = Job::IsStopped(this_00);
    }
    if (local_41 == false) break;
    if (this_00 != (Job *)0x0) {
      Job::~Job(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                ,0x6c,"void ot::commissioner::JobManager::CleanupJobs()");
}

Assistant:

void JobManager::CleanupJobs()
{
    for (auto job : mJobPool)
    {
        ASSERT(job == nullptr || job->IsStopped());
        delete job;
    }
    mJobPool.clear();
    mImportFile.clear();
}